

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

void Frc_ManPlaceRandom(Frc_Man_t *p)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int *__ptr;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar1 = p->nObjs;
  lVar9 = (long)iVar1;
  __ptr = (int *)malloc(lVar9 * 4);
  auVar4 = _DAT_00912220;
  if (0 < lVar9) {
    lVar9 = lVar9 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar6 = 0;
    auVar10 = auVar10 ^ _DAT_00912220;
    auVar11 = _DAT_00912210;
    do {
      auVar12 = auVar11 ^ auVar4;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        __ptr[uVar6] = (int)uVar6;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        __ptr[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar9 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 2;
      auVar11._8_8_ = lVar9 + 2;
    } while ((iVar1 + 1U & 0xfffffffe) != uVar6);
    if (0 < iVar1) {
      lVar9 = 0;
      do {
        uVar5 = Gia_ManRandom(0);
        uVar2 = p->nObjs;
        uVar5 = uVar5 % uVar2;
        iVar1 = __ptr[lVar9];
        __ptr[lVar9] = __ptr[(int)uVar5];
        __ptr[(int)uVar5] = iVar1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (int)uVar2);
    }
  }
  iVar1 = p->nObjData;
  if ((iVar1 < 1) || (piVar3 = p->pObjData, piVar3 == (int *)0x0)) {
    if (__ptr == (int *)0x0) {
      return;
    }
  }
  else {
    iVar8 = 0;
    piVar7 = __ptr;
    do {
      piVar3[(long)iVar8 + 4] = *piVar7;
      iVar8 = iVar8 + ((uint)piVar3[iVar8] >> 4) + piVar3[(long)iVar8 + 1] + 6;
      piVar7 = piVar7 + 1;
    } while (iVar8 < iVar1);
  }
  free(__ptr);
  return;
}

Assistant:

void Frc_ManPlaceRandom( Frc_Man_t * p )
{
    Frc_Obj_t * pThis;
    int * pPlacement;
    int i, h, Temp, iNext, Counter;
    pPlacement = ABC_ALLOC( int, p->nObjs );
    for ( i = 0; i < p->nObjs; i++ )
        pPlacement[i] = i;
    for ( i = 0; i < p->nObjs; i++ )
    {
        iNext = Gia_ManRandom( 0 ) % p->nObjs;
        Temp = pPlacement[i];
        pPlacement[i] = pPlacement[iNext];
        pPlacement[iNext] = Temp;
    }
    Counter = 0;
    Frc_ManForEachObj( p, pThis, h )
        pThis->pPlace = pPlacement[Counter++];
    ABC_FREE( pPlacement );
}